

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O1

Vec_Int_t * Saig_ManBmcComputeMappingRefs(Aig_Man_t *p,Vec_Int_t *vMap)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  ulong uVar5;
  int *piVar6;
  Vec_Int_t *pVVar7;
  int *__s;
  int iVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  
  pVVar2 = p->vObjs;
  iVar1 = pVVar2->nSize;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar8 = iVar1;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar8;
  if (iVar8 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar8 << 2);
  }
  pVVar7->pArray = __s;
  pVVar7->nSize = iVar1;
  if (__s != (int *)0x0) {
    memset(__s,0,(long)iVar1 << 2);
  }
  pVVar3 = p->vCos;
  if (0 < pVVar3->nSize) {
    ppvVar4 = pVVar3->pArray;
    lVar9 = 0;
    do {
      uVar5 = *(ulong *)((long)ppvVar4[lVar9] + 8);
      if (uVar5 == 0) {
        uVar10 = 0xffffffff;
      }
      else {
        uVar10 = *(uint *)((uVar5 & 0xfffffffffffffffe) + 0x24);
      }
      if (((int)uVar10 < 0) || (iVar1 <= (int)uVar10)) {
LAB_0055ed50:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      __s[uVar10] = __s[uVar10] + 1;
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar3->nSize);
  }
  if (0 < pVVar2->nSize) {
    ppvVar4 = pVVar2->pArray;
    lVar9 = 0;
    do {
      if ((ppvVar4[lVar9] != (void *)0x0) &&
         (0xfffffffd < (*(uint *)((long)ppvVar4[lVar9] + 0x18) & 7) - 7)) {
        if (vMap->nSize <= lVar9) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar6 = vMap->pArray;
        uVar10 = piVar6[lVar9];
        if ((ulong)uVar10 != 0) {
          if (((int)uVar10 < 0) || (vMap->nSize <= (int)uVar10)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          lVar11 = 0;
          do {
            iVar8 = piVar6[(ulong)uVar10 + lVar11 + 1];
            if (-1 < (long)iVar8) {
              if (iVar1 <= iVar8) goto LAB_0055ed50;
              __s[iVar8] = __s[iVar8] + 1;
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 != 4);
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar2->nSize);
  }
  return pVVar7;
}

Assistant:

Vec_Int_t * Saig_ManBmcComputeMappingRefs( Aig_Man_t * p, Vec_Int_t * vMap )
{
    Vec_Int_t * vRefs;
    Aig_Obj_t * pObj;
    int i, iFan, * pData;
    vRefs = Vec_IntStart( Aig_ManObjNumMax(p) );
    Aig_ManForEachCo( p, pObj, i )
        Vec_IntAddToEntry( vRefs, Aig_ObjFaninId0(pObj), 1 );
    Aig_ManForEachNode( p, pObj, i )
    {
        if ( Vec_IntEntry(vMap, i) == 0 )
            continue;
        pData = Vec_IntEntryP( vMap, Vec_IntEntry(vMap, i) );
        for ( iFan = 0; iFan < 4; iFan++ )
            if ( pData[iFan+1] >= 0 )
                Vec_IntAddToEntry( vRefs, pData[iFan+1], 1 );
    }
    return vRefs;
}